

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

void __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Prefix(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,Type type)

{
  char *pcVar1;
  Ch c;
  
  pcVar1 = (this->level_stack_).stackTop_;
  if (pcVar1 == (this->level_stack_).stack_) {
    this->hasRoot_ = true;
  }
  else {
    if (*(ulong *)(pcVar1 + -0x10) != 0) {
      c = ':';
      if (pcVar1[-8] != '\0') {
        c = ',';
      }
      if ((*(ulong *)(pcVar1 + -0x10) & 1) == 0) {
        c = ',';
      }
      GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,c);
    }
    *(long *)(pcVar1 + -0x10) = *(long *)(pcVar1 + -0x10) + 1;
  }
  return;
}

Assistant:

bool Null()                 { Prefix(kNullType);   return EndValue(WriteNull()); }